

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_LinetypeSegment>::Append
          (ON_SimpleArray<ON_LinetypeSegment> *this,ON_LinetypeSegment *x)

{
  uint uVar1;
  int iVar2;
  ON_LinetypeSegment *pOVar3;
  void *temp;
  ON_LinetypeSegment *pOStack_20;
  int newcapacity;
  ON_LinetypeSegment *p;
  ON_LinetypeSegment *x_local;
  ON_SimpleArray<ON_LinetypeSegment> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_LinetypeSegment *)onmalloc(0x10);
      pOStack_20->m_length = x->m_length;
      uVar1 = x->m_reserved2;
      pOStack_20->m_seg_type = x->m_seg_type;
      pOStack_20->m_reserved2 = uVar1;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (ON_LinetypeSegment *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  pOVar3 = this->m_a + iVar2;
  pOVar3->m_length = pOStack_20->m_length;
  uVar1 = pOStack_20->m_reserved2;
  pOVar3->m_seg_type = pOStack_20->m_seg_type;
  pOVar3->m_reserved2 = uVar1;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}